

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::BackUp(CopyingInputStreamAdaptor *this,int count)

{
  string *psVar1;
  LogMessage aLStack_18 [16];
  
  if ((this->backup_bytes_ == 0) &&
     ((this->buffer_)._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0)) {
    if (this->buffer_used_ < count) {
      psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)count,(long)this->buffer_used_,"count <= buffer_used_");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)aLStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0xe7,*(undefined8 *)(psVar1 + 8),*(undefined8 *)psVar1);
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (aLStack_18,
                 (char (*) [78])
                 " Can\'t back up over more bytes than were returned by the last call to Next().");
    }
    else {
      if (-1 < count) {
        this->backup_bytes_ = count;
        return;
      }
      psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)count,0,"count >= 0");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)aLStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0xea,*(undefined8 *)(psVar1 + 8),*(undefined8 *)psVar1);
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (aLStack_18,(char (*) [42])" Parameter to BackUp() can\'t be negative.");
    }
  }
  else {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aLStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xe5,0x2b,"backup_bytes_ == 0 && buffer_.get() != NULL");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_18,0x2a," BackUp() can only be called after Next().");
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_18)
  ;
}

Assistant:

void CopyingInputStreamAdaptor::BackUp(int count) {
  ABSL_CHECK(backup_bytes_ == 0 && buffer_.get() != NULL)
      << " BackUp() can only be called after Next().";
  ABSL_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";
  ABSL_CHECK_GE(count, 0) << " Parameter to BackUp() can't be negative.";

  backup_bytes_ = count;
}